

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Title *this;
  Paragraph *this_00;
  undefined8 *puVar1;
  Paragraph *pPVar2;
  int i;
  uint uVar3;
  long lVar4;
  char text [128];
  
  this = (Title *)operator_new(0xa0);
  Title::Title(this);
  (*(this->super_Paragraph).super_Section._vptr_Section[3])(this,"Test Document");
  this_00 = (Paragraph *)operator_new(0xa0);
  Paragraph::Paragraph(this_00);
  (*(this_00->super_Section)._vptr_Section[3])(this_00,"...this is a document in composite");
  (*(this_00->super_Section)._vptr_Section[4])(this_00,this);
  puVar1 = (undefined8 *)operator_new__(0x50);
  for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
    text[0x70] = '\0';
    text[0x71] = '\0';
    text[0x72] = '\0';
    text[0x73] = '\0';
    text[0x74] = '\0';
    text[0x75] = '\0';
    text[0x76] = '\0';
    text[0x77] = '\0';
    text[0x78] = '\0';
    text[0x79] = '\0';
    text[0x7a] = '\0';
    text[0x7b] = '\0';
    text[0x7c] = '\0';
    text[0x7d] = '\0';
    text[0x7e] = '\0';
    text[0x7f] = '\0';
    text[0x60] = '\0';
    text[0x61] = '\0';
    text[0x62] = '\0';
    text[99] = '\0';
    text[100] = '\0';
    text[0x65] = '\0';
    text[0x66] = '\0';
    text[0x67] = '\0';
    text[0x68] = '\0';
    text[0x69] = '\0';
    text[0x6a] = '\0';
    text[0x6b] = '\0';
    text[0x6c] = '\0';
    text[0x6d] = '\0';
    text[0x6e] = '\0';
    text[0x6f] = '\0';
    text[0x50] = '\0';
    text[0x51] = '\0';
    text[0x52] = '\0';
    text[0x53] = '\0';
    text[0x54] = '\0';
    text[0x55] = '\0';
    text[0x56] = '\0';
    text[0x57] = '\0';
    text[0x58] = '\0';
    text[0x59] = '\0';
    text[0x5a] = '\0';
    text[0x5b] = '\0';
    text[0x5c] = '\0';
    text[0x5d] = '\0';
    text[0x5e] = '\0';
    text[0x5f] = '\0';
    text[0x40] = '\0';
    text[0x41] = '\0';
    text[0x42] = '\0';
    text[0x43] = '\0';
    text[0x44] = '\0';
    text[0x45] = '\0';
    text[0x46] = '\0';
    text[0x47] = '\0';
    text[0x48] = '\0';
    text[0x49] = '\0';
    text[0x4a] = '\0';
    text[0x4b] = '\0';
    text[0x4c] = '\0';
    text[0x4d] = '\0';
    text[0x4e] = '\0';
    text[0x4f] = '\0';
    text[0x30] = '\0';
    text[0x31] = '\0';
    text[0x32] = '\0';
    text[0x33] = '\0';
    text[0x34] = '\0';
    text[0x35] = '\0';
    text[0x36] = '\0';
    text[0x37] = '\0';
    text[0x38] = '\0';
    text[0x39] = '\0';
    text[0x3a] = '\0';
    text[0x3b] = '\0';
    text[0x3c] = '\0';
    text[0x3d] = '\0';
    text[0x3e] = '\0';
    text[0x3f] = '\0';
    text[0x20] = '\0';
    text[0x21] = '\0';
    text[0x22] = '\0';
    text[0x23] = '\0';
    text[0x24] = '\0';
    text[0x25] = '\0';
    text[0x26] = '\0';
    text[0x27] = '\0';
    text[0x28] = '\0';
    text[0x29] = '\0';
    text[0x2a] = '\0';
    text[0x2b] = '\0';
    text[0x2c] = '\0';
    text[0x2d] = '\0';
    text[0x2e] = '\0';
    text[0x2f] = '\0';
    text[0x10] = '\0';
    text[0x11] = '\0';
    text[0x12] = '\0';
    text[0x13] = '\0';
    text[0x14] = '\0';
    text[0x15] = '\0';
    text[0x16] = '\0';
    text[0x17] = '\0';
    text[0x18] = '\0';
    text[0x19] = '\0';
    text[0x1a] = '\0';
    text[0x1b] = '\0';
    text[0x1c] = '\0';
    text[0x1d] = '\0';
    text[0x1e] = '\0';
    text[0x1f] = '\0';
    text[0] = '\0';
    text[1] = '\0';
    text[2] = '\0';
    text[3] = '\0';
    text[4] = '\0';
    text[5] = '\0';
    text[6] = '\0';
    text[7] = '\0';
    text[8] = '\0';
    text[9] = '\0';
    text[10] = '\0';
    text[0xb] = '\0';
    text[0xc] = '\0';
    text[0xd] = '\0';
    text[0xe] = '\0';
    text[0xf] = '\0';
    sprintf(text,"this is paragraph %d",(ulong)((int)lVar4 + 1));
    pPVar2 = (Paragraph *)operator_new(0xa0);
    Paragraph::Paragraph(pPVar2);
    puVar1[lVar4] = pPVar2;
    (*(pPVar2->super_Section)._vptr_Section[3])(pPVar2,text);
    (*(this_00->super_Section)._vptr_Section[4])(this_00,pPVar2);
  }
  for (uVar3 = 1; uVar3 != 4; uVar3 = uVar3 + 1) {
    text[0x70] = '\0';
    text[0x71] = '\0';
    text[0x72] = '\0';
    text[0x73] = '\0';
    text[0x74] = '\0';
    text[0x75] = '\0';
    text[0x76] = '\0';
    text[0x77] = '\0';
    text[0x78] = '\0';
    text[0x79] = '\0';
    text[0x7a] = '\0';
    text[0x7b] = '\0';
    text[0x7c] = '\0';
    text[0x7d] = '\0';
    text[0x7e] = '\0';
    text[0x7f] = '\0';
    text[0x60] = '\0';
    text[0x61] = '\0';
    text[0x62] = '\0';
    text[99] = '\0';
    text[100] = '\0';
    text[0x65] = '\0';
    text[0x66] = '\0';
    text[0x67] = '\0';
    text[0x68] = '\0';
    text[0x69] = '\0';
    text[0x6a] = '\0';
    text[0x6b] = '\0';
    text[0x6c] = '\0';
    text[0x6d] = '\0';
    text[0x6e] = '\0';
    text[0x6f] = '\0';
    text[0x50] = '\0';
    text[0x51] = '\0';
    text[0x52] = '\0';
    text[0x53] = '\0';
    text[0x54] = '\0';
    text[0x55] = '\0';
    text[0x56] = '\0';
    text[0x57] = '\0';
    text[0x58] = '\0';
    text[0x59] = '\0';
    text[0x5a] = '\0';
    text[0x5b] = '\0';
    text[0x5c] = '\0';
    text[0x5d] = '\0';
    text[0x5e] = '\0';
    text[0x5f] = '\0';
    text[0x40] = '\0';
    text[0x41] = '\0';
    text[0x42] = '\0';
    text[0x43] = '\0';
    text[0x44] = '\0';
    text[0x45] = '\0';
    text[0x46] = '\0';
    text[0x47] = '\0';
    text[0x48] = '\0';
    text[0x49] = '\0';
    text[0x4a] = '\0';
    text[0x4b] = '\0';
    text[0x4c] = '\0';
    text[0x4d] = '\0';
    text[0x4e] = '\0';
    text[0x4f] = '\0';
    text[0x30] = '\0';
    text[0x31] = '\0';
    text[0x32] = '\0';
    text[0x33] = '\0';
    text[0x34] = '\0';
    text[0x35] = '\0';
    text[0x36] = '\0';
    text[0x37] = '\0';
    text[0x38] = '\0';
    text[0x39] = '\0';
    text[0x3a] = '\0';
    text[0x3b] = '\0';
    text[0x3c] = '\0';
    text[0x3d] = '\0';
    text[0x3e] = '\0';
    text[0x3f] = '\0';
    text[0x20] = '\0';
    text[0x21] = '\0';
    text[0x22] = '\0';
    text[0x23] = '\0';
    text[0x24] = '\0';
    text[0x25] = '\0';
    text[0x26] = '\0';
    text[0x27] = '\0';
    text[0x28] = '\0';
    text[0x29] = '\0';
    text[0x2a] = '\0';
    text[0x2b] = '\0';
    text[0x2c] = '\0';
    text[0x2d] = '\0';
    text[0x2e] = '\0';
    text[0x2f] = '\0';
    text[0x10] = '\0';
    text[0x11] = '\0';
    text[0x12] = '\0';
    text[0x13] = '\0';
    text[0x14] = '\0';
    text[0x15] = '\0';
    text[0x16] = '\0';
    text[0x17] = '\0';
    text[0x18] = '\0';
    text[0x19] = '\0';
    text[0x1a] = '\0';
    text[0x1b] = '\0';
    text[0x1c] = '\0';
    text[0x1d] = '\0';
    text[0x1e] = '\0';
    text[0x1f] = '\0';
    text[0] = '\0';
    text[1] = '\0';
    text[2] = '\0';
    text[3] = '\0';
    text[4] = '\0';
    text[5] = '\0';
    text[6] = '\0';
    text[7] = '\0';
    text[8] = '\0';
    text[9] = '\0';
    text[10] = '\0';
    text[0xb] = '\0';
    text[0xc] = '\0';
    text[0xd] = '\0';
    text[0xe] = '\0';
    text[0xf] = '\0';
    sprintf(text,"\tsub-paragraph %d",(ulong)uVar3);
    pPVar2 = (Paragraph *)operator_new(0xa0);
    Paragraph::Paragraph(pPVar2);
    (*(pPVar2->super_Section)._vptr_Section[3])(pPVar2,text);
    (**(code **)(*(long *)*puVar1 + 0x20))((long *)*puVar1,pPVar2);
  }
  (*(this_00->super_Section)._vptr_Section[2])(this_00);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	Paragraph* title = new Title();
	title->setText("Test Document");

	Paragraph *root = new Paragraph();
	root->setText("...this is a document in composite");

	root->appendSector(title);
	Paragraph** list = new Paragraph*[10];
	for (int i = 0; i < 10; ++i) {
		char text[128];
		memset(text, 0x00, sizeof(text));
		sprintf(text, "this is paragraph %d", i + 1);

		list[i] = new Paragraph();
		list[i]->setText(text);
		root->appendSector(list[i]);
	}

	Paragraph** subList = new Paragraph*[3];
	for (int i = 0; i < 3; ++i) {
		char text[128];
		memset(text, 0x00, sizeof(text));
		sprintf(text, "\tsub-paragraph %d", i + 1);

		subList[i] = new Paragraph();
		subList[i]->setText(text);
		list[0]->appendSector(subList[i]);
	}

	root->print();

	return 0;
}